

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall
skiwi::anon_unknown_23::c_input_test_mix_ints_doubles_2::test(c_input_test_mix_ints_doubles_2 *this)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> local_2d8;
  undefined8 local_2c8;
  uint64_t res;
  fun_ptr f;
  uint64_t size;
  first_pass_data d;
  logic_error e;
  undefined1 local_230 [56];
  asmcode code;
  bool error;
  allocator<char> local_1b9;
  string local_1b8 [8];
  string script;
  stringstream str;
  undefined1 local_188 [376];
  pointer local_10;
  c_input_test_mix_ints_doubles_2 *this_local;
  
  local_10 = (pointer)this;
  std::__cxx11::stringstream::stringstream((stringstream *)(script.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,
             "\n(c-input \"(int a, double b, int c, double d, int e, double f, int g, double h, int i, double j,\n           int k, double l, int m, double n, int o, double p, int q, double r, int s, double t) \" )\n\n(+ a b c d e f g h i j k l m n o p q r s t)\n"
             ,&local_1b9);
  std::allocator<char>::~allocator(&local_1b9);
  assembler::asmcode::asmcode((asmcode *)(local_230 + 0x30));
  compile_fixture::get_asmcode((compile_fixture *)local_230,(string *)this);
  assembler::asmcode::operator=((asmcode *)(local_230 + 0x30),(asmcode *)local_230);
  assembler::asmcode::~asmcode((asmcode *)local_230);
  assembler::first_pass_data::first_pass_data((first_pass_data *)&size);
  res = assembler::assemble((ulong *)&f,(first_pass_data *)&size,(asmcode *)(local_230 + 0x30));
  if ((code *)res != (code *)0x0) {
    uVar1 = (*(code *)res)(0x4000cccccccccccd,0x4010666666666666,0x4018666666666666,
                           0x4020333333333333,0x4024333333333333,0x4069033333333333,
                           0x407901999999999a,0x4082c0cccccccccd,&(this->super_compile_fixture).ctxt
                           ,1,3,5,7,9,100,300,500,700,0x408900cccccccccd,900,0x408f40cccccccccd);
    local_2c8 = uVar1;
    std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::shared_ptr
              (&local_2d8,&(this->super_compile_fixture).env);
    skiwi::scheme_runtime(uVar1,local_188,&local_2d8,&(this->super_compile_fixture).rd,0);
    std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::~shared_ptr(&local_2d8);
    std::
    vector<std::pair<unsigned_long(*)(void*,...),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,...),unsigned_long>>>
    ::emplace_back<unsigned_long(*&)(void*,___),unsigned_long&>
              ((vector<std::pair<unsigned_long(*)(void*,___),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,___),unsigned_long>>>
                *)&(this->super_compile_fixture).compiled_functions,
               (_func_unsigned_long_void_ptr_varargs **)&res,(unsigned_long *)&f);
  }
  assembler::first_pass_data::~first_pass_data((first_pass_data *)&size);
  std::__cxx11::stringstream::str();
  TestEq<char_const*,std::__cxx11::string>
            ("5556",&local_2f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x16fe,"void skiwi::(anonymous namespace)::c_input_test_mix_ints_doubles_2::test()");
  std::__cxx11::string::~string((string *)&local_2f8);
  assembler::asmcode::~asmcode((asmcode *)(local_230 + 0x30));
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::stringstream::~stringstream((stringstream *)(script.field_2._M_local_buf + 8));
  return;
}

Assistant:

void test()
      {
      std::stringstream str;
      std::string script = R"(
(c-input "(int a, double b, int c, double d, int e, double f, int g, double h, int i, double j,
           int k, double l, int m, double n, int o, double p, int q, double r, int s, double t) " )

(+ a b c d e f g h i j k l m n o p q r s t)
)";
      bool error = false;
      asmcode code;
      try
        {
        code = get_asmcode(script);
        }
      catch (std::logic_error e)
        {
        error = true;
        str << e.what();
        }
      if (!error)
        {
        first_pass_data d;
        uint64_t size;
        fun_ptr f = (fun_ptr)assemble(size, d, code);
        if (f)
          {
          // important to cast to int64_t. Otherwise 32-bit version dword [rsp] is used to pass parameters, and there will be bagger in the upper half of the 64-bit register.
          uint64_t res = f(&ctxt, (int64_t)1, (double)2.1, (int64_t)3, (double)4.1, (int64_t)5, (double)6.1, (int64_t)7, (double)8.1, (int64_t)9, (double)10.1,
          (int64_t)100, (double)200.1, (int64_t)300, (double)400.1, (int64_t)500, (double)600.1, (int64_t)700, (double)800.1, (int64_t)900, (double)1000.1
          );
          scheme_runtime(res, str, env, rd, nullptr);        

          compiled_functions.emplace_back(f, size);
          }
        }
      TEST_EQ("5556", str.str());
      }